

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::InitializeVacuumState
          (RowGroupCollection *this,CollectionCheckpointState *checkpoint_state,VacuumState *state,
          vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *segments)

{
  pointer pSVar1;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> this_00;
  iterator __position;
  bool bVar2;
  int iVar3;
  unsigned_long in_RAX;
  DataTableInfo *pDVar4;
  type this_01;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *this_02;
  pointer pSVar5;
  idx_t row_group_count;
  unsigned_long local_38;
  
  local_38 = in_RAX;
  iVar3 = (*checkpoint_state->writer->_vptr_TableDataWriter[5])();
  pDVar4 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  bVar2 = TableIndexList::Empty(&pDVar4->indexes);
  state->can_vacuum_deletes = bVar2 && iVar3 == 0;
  if (bVar2 && iVar3 == 0) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (&(state->row_group_counts).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               (long)(segments->
                     super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                     ).
                     super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(segments->
                     super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                     ).
                     super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    pSVar5 = (segments->
             super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ).
             super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (segments->
             super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ).
             super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar5 != pSVar1) {
      this_02 = &pSVar5->node;
      do {
        this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                  operator*(this_02);
        local_38 = RowGroup::GetCommittedRowCount(this_01);
        if (local_38 == 0) {
          RowGroup::CommitDrop(this_01);
          this_00._M_head_impl =
               (this_02->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
               ._M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
               super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
          (this_02->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t
          .super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
          super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
          if (this_00._M_head_impl != (RowGroup *)0x0) {
            RowGroup::~RowGroup(this_00._M_head_impl);
            operator_delete(this_00._M_head_impl);
          }
        }
        __position._M_current =
             (state->row_group_counts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (state->row_group_counts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&state->row_group_counts
                     ,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          (state->row_group_counts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pSVar5 = (pointer)(this_02 + 1);
        this_02 = this_02 + 2;
      } while (pSVar5 != pSVar1);
    }
  }
  return;
}

Assistant:

void RowGroupCollection::InitializeVacuumState(CollectionCheckpointState &checkpoint_state, VacuumState &state,
                                               vector<SegmentNode<RowGroup>> &segments) {
	bool is_full_checkpoint = checkpoint_state.writer.GetCheckpointType() == CheckpointType::FULL_CHECKPOINT;
	// currently we can only vacuum deletes if we are doing a full checkpoint and there are no indexes
	state.can_vacuum_deletes = info->GetIndexes().Empty() && is_full_checkpoint;
	if (!state.can_vacuum_deletes) {
		return;
	}
	// obtain the set of committed row counts for each row group
	state.row_group_counts.reserve(segments.size());
	for (auto &entry : segments) {
		auto &row_group = *entry.node;
		auto row_group_count = row_group.GetCommittedRowCount();
		if (row_group_count == 0) {
			// empty row group - we can drop it entirely
			row_group.CommitDrop();
			entry.node.reset();
		}
		state.row_group_counts.push_back(row_group_count);
	}
}